

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O1

bool __thiscall cmCPackIFWRepository::IsValid(cmCPackIFWRepository *this)

{
  size_type sVar1;
  
  switch(this->Update) {
  case None:
  case Add:
  case Remove:
    sVar1 = (this->Url)._M_string_length;
    break;
  case Replace:
    if ((this->OldUrl)._M_string_length == 0) {
      return false;
    }
    sVar1 = (this->NewUrl)._M_string_length;
    break;
  default:
    return true;
  }
  return sVar1 != 0;
}

Assistant:

bool cmCPackIFWRepository::IsValid() const
{
  bool valid = true;

  switch (this->Update) {
    case cmCPackIFWRepository::None:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Add:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Remove:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Replace:
      valid = !this->OldUrl.empty() && !this->NewUrl.empty();
      break;
  }

  return valid;
}